

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O0

void __thiscall CaDiCaL::Checker::enlarge_vars(Checker *this,int64_t idx)

{
  char *__new_size;
  void *pvVar1;
  char *pcVar2;
  vector<signed_char,_std::allocator<signed_char>_> *in_RSI;
  long in_RDI;
  char *new_vals;
  int64_t new_size_vars;
  size_t in_stack_ffffffffffffffc8;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    __new_size = (char *)0x2;
    pcVar2 = __new_size;
  }
  else {
    __new_size = (char *)(*(long *)(in_RDI + 0x10) << 1);
    pcVar2 = __new_size;
  }
  for (; (long)__new_size <= (long)in_RSI; __new_size = (char *)((long)__new_size << 1)) {
  }
  pvVar1 = operator_new__((long)__new_size << 1);
  clear_n<signed_char>(pcVar2,in_stack_ffffffffffffffc8);
  pcVar2 = __new_size + (long)pvVar1;
  if (*(long *)(in_RDI + 0x10) != 0) {
    memcpy(pcVar2 + -*(long *)(in_RDI + 0x10),
           (void *)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10)),
           *(long *)(in_RDI + 0x10) << 1);
  }
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10);
  if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x18));
  }
  *(char **)(in_RDI + 0x18) = pcVar2;
  *(char **)(in_RDI + 0x10) = __new_size;
  std::
  vector<std::vector<CaDiCaL::CheckerWatch,_std::allocator<CaDiCaL::CheckerWatch>_>,_std::allocator<std::vector<CaDiCaL::CheckerWatch,_std::allocator<CaDiCaL::CheckerWatch>_>_>_>
  ::resize((vector<std::vector<CaDiCaL::CheckerWatch,_std::allocator<CaDiCaL::CheckerWatch>_>,_std::allocator<std::vector<CaDiCaL::CheckerWatch,_std::allocator<CaDiCaL::CheckerWatch>_>_>_>
            *)in_RSI,(size_type)__new_size);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(in_RSI,(size_type)__new_size);
  return;
}

Assistant:

void Checker::enlarge_vars (int64_t idx) {

  assert (0 < idx), assert (idx <= INT_MAX);

  int64_t new_size_vars = size_vars ? 2 * size_vars : 2;
  while (idx >= new_size_vars)
    new_size_vars *= 2;
  LOG ("CHECKER enlarging variables of checker from %" PRId64 " to %" PRId64
       "",
       size_vars, new_size_vars);

  signed char *new_vals;
  new_vals = new signed char[2 * new_size_vars];
  clear_n (new_vals, 2 * new_size_vars);
  new_vals += new_size_vars;
  if (size_vars) // To make sanitizer happy (without '-O').
    memcpy ((void *) (new_vals - size_vars), (void *) (vals - size_vars),
            2 * size_vars);
  vals -= size_vars;
  delete[] vals;
  vals = new_vals;
  size_vars = new_size_vars;

  watchers.resize (2 * new_size_vars);
  marks.resize (2 * new_size_vars);

  assert (idx < new_size_vars);
}